

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void parse_label(LexState *ls)

{
  FuncState *pFVar1;
  MSize idx_00;
  int iVar2;
  GCstr *name_00;
  VarInfo *pVVar3;
  MSize idx;
  GCstr *name;
  FuncState *fs;
  LexState *ls_local;
  
  pFVar1 = ls->fs;
  pFVar1->lasttarget = pFVar1->pc;
  pFVar1->bl->flags = pFVar1->bl->flags | 4;
  lj_lex_next(ls);
  name_00 = lex_str(ls);
  pVVar3 = gola_findlabel(ls,name_00);
  if (pVVar3 != (VarInfo *)0x0) {
    lj_lex_error(ls,0,LJ_ERR_XLDUP,name_00 + 1);
  }
  idx_00 = gola_new(ls,name_00,'\x04',pFVar1->pc);
  lex_check(ls,0x11d);
  while (ls->tok == 0x11d) {
    synlevel_begin(ls);
    parse_label(ls);
    ls->level = ls->level - 1;
  }
  iVar2 = parse_isend(ls->tok);
  if ((iVar2 != 0) && (ls->tok != 0x115)) {
    ls->vstack[idx_00].slot = pFVar1->bl->nactvar;
  }
  gola_resolve(ls,pFVar1->bl,idx_00);
  return;
}

Assistant:

static void parse_label(LexState *ls)
{
  FuncState *fs = ls->fs;
  GCstr *name;
  MSize idx;
  fs->lasttarget = fs->pc;
  fs->bl->flags |= FSCOPE_GOLA;
  lj_lex_next(ls);  /* Skip '::'. */
  name = lex_str(ls);
  if (gola_findlabel(ls, name))
    lj_lex_error(ls, 0, LJ_ERR_XLDUP, strdata(name));
  idx = gola_new(ls, name, VSTACK_LABEL, fs->pc);
  lex_check(ls, TK_label);
  /* Recursively parse trailing statements: labels and ';' (Lua 5.2 only). */
  for (;;) {
    if (ls->tok == TK_label) {
      synlevel_begin(ls);
      parse_label(ls);
      synlevel_end(ls);
    } else if (LJ_52 && ls->tok == ';') {
      lj_lex_next(ls);
    } else {
      break;
    }
  }
  /* Trailing label is considered to be outside of scope. */
  if (parse_isend(ls->tok) && ls->tok != TK_until)
    ls->vstack[idx].slot = fs->bl->nactvar;
  gola_resolve(ls, fs->bl, idx);
}